

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall
OpenMesh::
PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
::set_persistent(PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
                 *this,bool _yn)

{
  mostream *pmVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,_yn) != 0) {
    pmVar1 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar1->super_ostream,"Warning! Type of property value is not binary storable!\n",
               0x38);
  }
  (this->super_BaseProperty).persistent_ = false;
  return;
}

Assistant:

virtual void set_persistent( bool _yn )
  { check_and_set_persistent<T>( _yn ); }